

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inflate_copy.cc
# Opt level: O0

void __thiscall
inflate_copy_back_and_forth_Test::~inflate_copy_back_and_forth_Test
          (inflate_copy_back_and_forth_Test *this)

{
  void *in_RDI;
  
  ~inflate_copy_back_and_forth_Test((inflate_copy_back_and_forth_Test *)0x136f88);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(inflate, copy_back_and_forth) {
    PREFIX3(stream) d1_stream, d2_stream;
    int err;

    memset(&d1_stream, 0, sizeof(d1_stream));
    err = PREFIX(inflateInit2)(&d1_stream, MAX_WBITS + 14);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateCopy)(&d2_stream, &d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateCopy)(&d1_stream, &d2_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d1_stream);
    ASSERT_EQ(err, Z_OK);
    err = PREFIX(inflateEnd)(&d2_stream);
    ASSERT_EQ(err, Z_OK);
}